

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall
fmt::internal::PrintfFormatter<char>::parse_flags
          (PrintfFormatter<char> *this,FormatSpec *spec,char **s)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  
  uVar3 = spec->flags_;
  pbVar4 = (byte *)*s;
  do {
    while( true ) {
      pbVar1 = pbVar4 + 1;
      *s = (char *)pbVar1;
      bVar2 = *pbVar4;
      if (bVar2 < 0x2d) break;
      if (bVar2 == 0x30) {
        (spec->super_AlignSpec).super_WidthSpec.fill_ = L'0';
        pbVar4 = pbVar1;
      }
      else {
        if (bVar2 != 0x2d) goto LAB_0010b7fc;
        (spec->super_AlignSpec).align_ = ALIGN_LEFT;
        pbVar4 = pbVar1;
      }
    }
    if (bVar2 == 0x20) {
      uVar3 = uVar3 | 1;
    }
    else if (bVar2 == 0x23) {
      uVar3 = uVar3 | 8;
    }
    else {
      if (bVar2 != 0x2b) {
LAB_0010b7fc:
        *s = (char *)pbVar4;
        return;
      }
      uVar3 = uVar3 | 3;
    }
    spec->flags_ = uVar3;
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::parse_flags(
    FormatSpec &spec, const Char *&s) {
  for (;;) {
    switch (*s++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags_ |= SIGN_FLAG;
        break;
      case '#':
        spec.flags_ |= HASH_FLAG;
        break;
      default:
        --s;
        return;
    }
  }
}